

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_15bad7::EqualizerState::deviceUpdate(EqualizerState *this,ALCdevice *param_1)

{
  _Mem_fn<void_(BiquadFilterR<float>::*)()> __f;
  long lVar1;
  offset_in_BiquadFilterR<float>_to_subr unaff_RBX;
  undefined8 unaff_R12;
  long lVar2;
  float *pfVar3;
  
  pfVar3 = this->mChans[0].CurrentGains;
  for (lVar2 = 0x20; lVar2 != 0xf20; lVar2 = lVar2 + 0xf0) {
    __f.super__Mem_fn_base<void_(BiquadFilterR<float>::*)(),_true>._8_8_ = unaff_R12;
    __f.super__Mem_fn_base<void_(BiquadFilterR<float>::*)(),_true>._M_pmf = unaff_RBX;
    std::for_each<BiquadFilterR<float>*,std::_Mem_fn<void(BiquadFilterR<float>::*)()>>
              ((_Mem_fn<void_(BiquadFilterR<float>::*)()> *)
               ((long)this->mChans[0].filter + lVar2 + -0x20),
               (BiquadFilterR<float> *)((long)&this->mChans[0].filter[2].mA2 + lVar2),
               (BiquadFilterR<float> *)BiquadFilterR<float>::clear,__f);
    for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 4) {
      *(undefined4 *)((long)pfVar3 + lVar1) = 0;
    }
    pfVar3 = pfVar3 + 0x3c;
  }
  return;
}

Assistant:

void EqualizerState::deviceUpdate(const ALCdevice*)
{
    for(auto &e : mChans)
    {
        std::for_each(std::begin(e.filter), std::end(e.filter), std::mem_fn(&BiquadFilter::clear));
        std::fill(std::begin(e.CurrentGains), std::end(e.CurrentGains), 0.0f);
    }
}